

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void * __thiscall google::protobuf::Arena::SlowAlloc(Arena *this,size_t n)

{
  undefined8 *me;
  long lVar1;
  size_t sVar2;
  Block *pBVar3;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  me = (undefined8 *)(lVar1 + -0x10);
  pBVar3 = FindBlock(this,me);
  if ((pBVar3 == (Block *)0x0) || (pBVar3->size - pBVar3->pos < n)) {
    pBVar3 = NewBlock(this,me,pBVar3,n,*(size_t *)(this + 0x40),*(size_t *)(this + 0x48));
    AddBlock(this,pBVar3);
    *(Block **)(lVar1 + -8) = pBVar3;
    *me = *(undefined8 *)this;
    pBVar3 = pBVar3 + 1;
  }
  else {
    *(Block **)(lVar1 + -8) = pBVar3;
    *me = *(undefined8 *)this;
    *(Block **)(this + 0x10) = pBVar3;
    sVar2 = pBVar3->pos;
    pBVar3->pos = n + sVar2;
    pBVar3 = (Block *)((long)&pBVar3->owner + sVar2);
  }
  return pBVar3;
}

Assistant:

void* Arena::SlowAlloc(size_t n) {
  void* me = &thread_cache();
  Block* b = FindBlock(me);  // Find block owned by me.
  // See if allocation fits in my latest block.
  if (b != NULL && b->avail() >= n) {
    SetThreadCacheBlock(b);
    google::protobuf::internal::NoBarrier_Store(&hint_, reinterpret_cast<google::protobuf::internal::AtomicWord>(b));
    return AllocFromBlock(b, n);
  }
  b = NewBlock(me, b, n, options_.start_block_size, options_.max_block_size);
  AddBlock(b);
  SetThreadCacheBlock(b);
  return reinterpret_cast<char*>(b) + kHeaderSize;
}